

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O2

void ft_lzwstate_done(FT_LzwState state)

{
  FT_Memory memory;
  
  memory = state->memory;
  state->buf_total = 0;
  state->stack_top = 0;
  state->buf_offset = 0;
  state->buf_size = 0;
  state->buf_clear = '\0';
  state->num_bits = 9;
  state->phase = FT_LZW_PHASE_START;
  state->in_eof = 0;
  if (state->stack != state->stack_0) {
    ft_mem_free(memory,state->stack);
    state->stack = (FT_Byte *)0x0;
  }
  ft_mem_free(memory,state->prefix);
  memset(state,0,0xd8);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ft_lzwstate_done( FT_LzwState  state )
  {
    FT_Memory  memory = state->memory;


    ft_lzwstate_reset( state );

    if ( state->stack != state->stack_0 )
      FT_FREE( state->stack );

    FT_FREE( state->prefix );
    state->suffix = NULL;

    FT_ZERO( state );
  }